

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_allocator.hpp
# Opt level: O0

JsonValue * __thiscall
MercuryJson::BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue>
          (BlockAllocator<MercuryJson::JsonValue> *this)

{
  long *in_RDI;
  JsonValue *ret;
  size_t in_stack_ffffffffffffffd8;
  BlockAllocator<MercuryJson::JsonValue> *in_stack_ffffffffffffffe0;
  JsonValue *this_00;
  
  check_alloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = (JsonValue *)*in_RDI;
  JsonValue::JsonValue(this_00);
  *in_RDI = *in_RDI + 0x10;
  in_RDI[5] = in_RDI[5] + 0x10;
  return this_00;
}

Assistant:

T *construct(Args ...args) {
            check_alloc(sizeof(T));
            static constexpr size_t size = round_up(sizeof(T), kAlignment);
            T *ret = new(ptr) T(std::forward<Args>(args)...);
            ptr += size;
            allocated += size;
            return ret;
        }